

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlock.cpp
# Opt level: O0

uint __thiscall
Memory::SmallHeapBlockT<SmallAllocationBlockAttributes>::GetMarkCountForSweep
          (SmallHeapBlockT<SmallAllocationBlockAttributes> *this)

{
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  SmallHeapBlockBitVector *pSVar5;
  undefined1 local_30 [8];
  SmallHeapBlockBitVector temp;
  SmallHeapBlockT<SmallAllocationBlockAttributes> *this_local;
  
  temp.data[3].word = (Type)this;
  bVar2 = IsFreeBitsValid(this);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlock.cpp"
                       ,0x4c5,"(IsFreeBitsValid())","IsFreeBitsValid()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  BVStatic<256UL>::BVStatic((BVStatic<256UL> *)local_30);
  pSVar5 = GetMarkedBitVector(this);
  BVStatic<256UL>::Copy((BVStatic<256UL> *)local_30,pSVar5);
  pSVar5 = GetInvalidBitVector(this);
  BVStatic<256UL>::Minus((BVStatic<256UL> *)local_30,pSVar5);
  if (this->freeCount != 0) {
    pSVar5 = GetFreeBitVector(this);
    BVStatic<256UL>::Minus((BVStatic<256UL> *)local_30,pSVar5);
  }
  BVar3 = BVStatic<256UL>::Count((BVStatic<256UL> *)local_30);
  return BVar3;
}

Assistant:

uint
SmallHeapBlockT<TBlockAttributes>::GetMarkCountForSweep()
{
    Assert(IsFreeBitsValid());

    // Make a local copy of mark bits, so we don't modify the actual mark bits.
    SmallHeapBlockBitVector temp;
    temp.Copy(this->GetMarkedBitVector());

    // Remove any invalid bits that may have been set
    temp.Minus(this->GetInvalidBitVector());

    // Remove the mark bit for things that are still free
    if (this->freeCount != 0)
    {
        temp.Minus(this->GetFreeBitVector());
    }

    return temp.Count();
}